

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::es30::isCoreTextureParam(GLenum pname)

{
  undefined1 local_d;
  GLenum pname_local;
  
  local_d = true;
  if (((((pname != 0x813c) && (local_d = true, pname != 0x884c)) &&
       (local_d = true, pname != 0x884d)) &&
      (((local_d = true, pname != 0x2800 && (local_d = true, pname != 0x813d)) &&
       ((local_d = true, pname != 0x813b &&
        ((local_d = true, pname != 0x2801 && (local_d = true, pname != 0x813a)))))))) &&
     ((local_d = true, pname != 0x8e42 &&
      (((((local_d = true, pname != 0x8e43 && (local_d = true, pname != 0x8e44)) &&
         (local_d = true, pname != 0x8e45)) &&
        ((local_d = true, pname != 0x2802 && (local_d = true, pname != 0x2803)))) &&
       ((local_d = true, pname != 0x8072 && (local_d = true, pname != 0x912f)))))))) {
    local_d = pname == 0x82df;
  }
  return local_d;
}

Assistant:

static bool isCoreTextureParam (glw::GLenum pname)
{
	return	pname == GL_TEXTURE_BASE_LEVEL			||
			pname == GL_TEXTURE_COMPARE_MODE		||
			pname == GL_TEXTURE_COMPARE_FUNC		||
			pname == GL_TEXTURE_MAG_FILTER			||
			pname == GL_TEXTURE_MAX_LEVEL			||
			pname == GL_TEXTURE_MAX_LOD				||
			pname == GL_TEXTURE_MIN_FILTER			||
			pname == GL_TEXTURE_MIN_LOD				||
			pname == GL_TEXTURE_SWIZZLE_R			||
			pname == GL_TEXTURE_SWIZZLE_G			||
			pname == GL_TEXTURE_SWIZZLE_B			||
			pname == GL_TEXTURE_SWIZZLE_A			||
			pname == GL_TEXTURE_WRAP_S				||
			pname == GL_TEXTURE_WRAP_T				||
			pname == GL_TEXTURE_WRAP_R				||
			pname == GL_TEXTURE_IMMUTABLE_FORMAT	||
			pname == GL_TEXTURE_IMMUTABLE_LEVELS;
}